

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::fc_<1000UL,_(dlib::fc_bias_mode)0>::fc_
          (fc_<1000UL,_(dlib::fc_bias_mode)0> *this,num_fc_outputs o)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  resizable_tensor *in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  resizable_tensor::resizable_tensor(in_stack_ffffffffffffffe0);
  alias_tensor::alias_tensor((alias_tensor *)0x12294b);
  alias_tensor::alias_tensor((alias_tensor *)0x12295e);
  in_RDI[0x27] = 0x3ff0000000000000;
  in_RDI[0x28] = 0x3ff0000000000000;
  in_RDI[0x29] = 0x3ff0000000000000;
  in_RDI[0x2a] = 0;
  *(undefined1 *)(in_RDI + 0x2b) = 1;
  return;
}

Assistant:

fc_(num_fc_outputs o) : num_outputs(o.num_outputs), num_inputs(0),
            learning_rate_multiplier(1),
            weight_decay_multiplier(1),
            bias_learning_rate_multiplier(1),
            bias_weight_decay_multiplier(0),
            use_bias(true)
        {}